

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void __thiscall Assimp::IFC::TempOpening::Transform(TempOpening *this,IfcMatrix4 *mat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  TempMesh *pTVar10;
  
  pTVar10 = (this->profileMesh).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pTVar10 != (TempMesh *)0x0) {
    TempMesh::Transform(pTVar10,mat);
  }
  pTVar10 = (this->profileMesh2D).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pTVar10 != (TempMesh *)0x0) {
    TempMesh::Transform(pTVar10,mat);
  }
  dVar1 = (this->extrusionDir).x;
  dVar2 = (this->extrusionDir).y;
  dVar3 = (this->extrusionDir).z;
  dVar4 = mat->c2;
  dVar5 = mat->c1;
  dVar6 = mat->c3;
  dVar7 = mat->b2;
  dVar8 = mat->b1;
  dVar9 = mat->b3;
  (this->extrusionDir).x = dVar3 * mat->a3 + dVar1 * mat->a1 + dVar2 * mat->a2;
  (this->extrusionDir).y = dVar3 * dVar9 + dVar1 * dVar8 + dVar2 * dVar7;
  (this->extrusionDir).z = dVar6 * dVar3 + dVar5 * dVar1 + dVar4 * dVar2;
  return;
}

Assistant:

void TempOpening::Transform(const IfcMatrix4& mat) {
    if(profileMesh) {
        profileMesh->Transform(mat);
    }
    if(profileMesh2D) {
        profileMesh2D->Transform(mat);
    }
    extrusionDir *= IfcMatrix3(mat);
}